

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins_tests.cpp
# Opt level: O3

void coins_tests::WriteCoinsViewEntry(CCoinsView *view,CAmount value,char flags)

{
  CoinsCachePair *pCVar1;
  CoinsCachePair *pCVar2;
  int iVar3;
  allocator_type *__a;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string file;
  const_string msg;
  size_t usage;
  CCoinsMap map;
  CoinsViewCacheCursor cursor;
  CCoinsMapMemoryResource resource;
  check_type cVar4;
  char *local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  lazy_ostream local_268;
  undefined1 *local_258;
  char **local_250;
  assertion_result local_248;
  undefined1 *local_230;
  undefined1 *local_228;
  char *local_220;
  char *local_218;
  size_t local_210;
  _Hashtable<COutPoint,_std::pair<const_COutPoint,_CCoinsCacheEntry>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_208;
  SaltedOutpointHasher local_1b8;
  _Hashtable<COutPoint,_std::pair<const_COutPoint,_CCoinsCacheEntry>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_1a8;
  undefined1 local_1a0;
  allocator_type local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  PoolResource<144UL,_8UL> local_170;
  CoinsCachePair local_a8;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_a8.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  local_a8.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  local_a8.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  local_a8.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  local_a8.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  local_a8.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  local_a8.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  local_a8.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  local_a8.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  local_a8.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  local_a8.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  local_a8.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  local_a8.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  local_a8.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  local_a8.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  local_a8.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  local_a8.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  local_a8.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  local_a8.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  local_a8.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  local_a8.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  local_a8.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  local_a8.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  local_a8.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  local_a8.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  local_a8.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  local_a8.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  local_a8.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  local_a8.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  local_a8.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  local_a8.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  local_a8.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  local_a8.first.n = 0xffffffff;
  local_a8.second.m_prev = (CoinsCachePair *)0x0;
  local_a8.second.m_next = (CoinsCachePair *)0x0;
  local_a8.second.m_flags = '\0';
  local_a8.second._17_7_ = 0;
  local_a8.second.coin.out.nValue = 0;
  local_a8.second.coin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect =
       (char *)0x0;
  local_a8.second.coin.out.scriptPubKey.super_CScriptBase._union._8_8_ = 0;
  local_a8.second.coin.out.scriptPubKey.super_CScriptBase._union._16_8_ = 0;
  local_a8.second.coin.out.scriptPubKey.super_CScriptBase._24_8_ = 0;
  local_a8.second.coin._40_8_ = 0;
  CCoinsCacheEntry::CCoinsCacheEntry(&local_a8.second);
  local_a8.second.m_prev = &local_a8;
  local_a8.second.m_flags = '\x01';
  local_a8.second.m_next = local_a8.second.m_prev;
  PoolResource<144UL,_8UL>::PoolResource(&local_170,0x40000);
  SaltedOutpointHasher::SaltedOutpointHasher(&local_1b8,false);
  __a = &local_198;
  local_198.m_resource = &local_170;
  std::
  _Hashtable<COutPoint,_std::pair<const_COutPoint,_CCoinsCacheEntry>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_Hashtable(&local_208,0,&local_1b8,(key_equal *)&local_268,__a);
  local_210 = InsertCoinsMapEntry((CCoinsMap *)&local_208,&local_a8,value,flags);
  local_1b8.k0 = (uint64_t)&local_210;
  local_1a0 = 1;
  local_220 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_218 = "";
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  local_228 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x278;
  file.m_begin = (iterator)&local_220;
  msg.m_end = in_R9;
  msg.m_begin = (iterator)__a;
  local_1b8.k1 = (uint64_t)&local_a8;
  local_1a8 = &local_208;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_230,msg);
  local_188 = 0;
  uStack_180 = 0;
  local_198.m_resource = (PoolResource<144UL,_8UL> *)0x0;
  uStack_190 = 0;
  iVar3 = (*view->_vptr_CCoinsView[4])(view,&local_1b8);
  local_248.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       SUB41(iVar3,0);
  local_248.m_message.px = (element_type *)0x0;
  local_248.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_250 = &local_278;
  local_278 = "view.BatchWrite(cursor, {})";
  local_270 = "";
  local_268.m_empty = false;
  local_268._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01389048;
  local_258 = boost::unit_test::lazy_ostream::inst;
  local_288 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_280 = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_248,&local_268,1,0,WARN,_cVar4,(size_t)&local_288,0x278);
  boost::detail::shared_count::~shared_count(&local_248.m_message.pn);
  std::
  _Hashtable<COutPoint,_std::pair<const_COutPoint,_CCoinsCacheEntry>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_208);
  PoolResource<144UL,_8UL>::~PoolResource(&local_170);
  pCVar2 = local_a8.second.m_next;
  pCVar1 = local_a8.second.m_prev;
  if (local_a8.second.m_flags != '\0') {
    ((local_a8.second.m_next)->second).m_prev = local_a8.second.m_prev;
    (pCVar1->second).m_next = pCVar2;
    local_a8.second.m_flags = '\0';
  }
  if (0x1c < local_a8.second.coin.out.scriptPubKey.super_CScriptBase._size) {
    free(local_a8.second.coin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void WriteCoinsViewEntry(CCoinsView& view, CAmount value, char flags)
{
    CoinsCachePair sentinel{};
    sentinel.second.SelfRef(sentinel);
    CCoinsMapMemoryResource resource;
    CCoinsMap map{0, CCoinsMap::hasher{}, CCoinsMap::key_equal{}, &resource};
    auto usage{InsertCoinsMapEntry(map, sentinel, value, flags)};
    auto cursor{CoinsViewCacheCursor(usage, sentinel, map, /*will_erase=*/true)};
    BOOST_CHECK(view.BatchWrite(cursor, {}));
}